

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O0

int receive_from_stopSock(SOCKET ssock,fd_set *set)

{
  ssize_t sVar1;
  char *pcVar2;
  char local_1d8 [8];
  char buf_ntop [46];
  char requestBuf [256];
  sockaddr_storage clientAddr;
  socklen_t clientLen;
  ssize_t byteReceived;
  fd_set *set_local;
  SOCKET ssock_local;
  
  if ((set->__fds_bits[ssock / 0x40] & 1L << ((byte)((long)ssock % 0x40) & 0x3f)) != 0) {
    clientAddr.__ss_align._4_4_ = 0x80;
    memset(requestBuf + 0xf8,0,0x80);
    sVar1 = recvfrom(ssock,buf_ntop + 0x28,0x19,0,(sockaddr *)(requestBuf + 0xf8),
                     (socklen_t *)((long)&clientAddr.__ss_align + 4));
    if (sVar1 < 1) {
      UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x259,
                 "miniserver: stopSock Error, aborting...\n");
      return 1;
    }
    buf_ntop[sVar1 + 0x28] = '\0';
    inet_ntop(2,requestBuf + 0xfc,local_1d8,0x2e);
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x248,
               "Received response: %s From host %s \n",buf_ntop + 0x28,local_1d8);
    UpnpPrintf(UPNP_ERROR,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x24f,
               "Received multicast packet: \n %s\n",buf_ntop + 0x28);
    pcVar2 = strstr(buf_ntop + 0x28,"ShutDown");
    if (pcVar2 != (char *)0x0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int receive_from_stopSock(SOCKET ssock, fd_set *set)
{
	ssize_t byteReceived;
	socklen_t clientLen;
	struct sockaddr_storage clientAddr;
	char requestBuf[256];
	char buf_ntop[INET6_ADDRSTRLEN];

	if (FD_ISSET(ssock, set)) {
		clientLen = sizeof(clientAddr);
		memset((char *)&clientAddr, 0, sizeof(clientAddr));
		byteReceived = recvfrom(ssock,
			requestBuf,
			(size_t)25,
			0,
			(struct sockaddr *)&clientAddr,
			&clientLen);
		if (byteReceived > 0) {
			requestBuf[byteReceived] = '\0';
			inet_ntop(AF_INET,
				&((struct sockaddr_in *)&clientAddr)->sin_addr,
				buf_ntop,
				sizeof(buf_ntop));
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"Received response: %s From host %s \n",
				requestBuf,
				buf_ntop);
			UpnpPrintf(UPNP_PACKET,
				MSERV,
				__FILE__,
				__LINE__,
				"Received multicast packet: \n %s\n",
				requestBuf);
			if (NULL != strstr(requestBuf, "ShutDown")) {
				return 1;
			}
		} else {
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"miniserver: stopSock Error, aborting...\n");
			return 1;
		}
	}

	return 0;
}